

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acecSt.c
# Opt level: O0

void Acec_GenerateNpnTable(void)

{
  uint uVar1;
  uint local_854;
  uint local_850;
  int nClasses;
  int k;
  int i;
  int Map [256];
  int Classes [16];
  int Table [256];
  
  local_854 = 0;
  for (nClasses = 0; nClasses < 0x100; nClasses = nClasses + 1) {
    uVar1 = Extra_TruthCanonNPN(nClasses,3);
    Classes[(long)nClasses + 0xe] = uVar1;
  }
  for (nClasses = 0; nClasses < 0x100; nClasses = nClasses + 1) {
    printf("{");
    Extra_PrintHex(_stdout,(uint *)(Classes + (long)nClasses + 0xe),3);
    printf(", ");
    local_850 = 0;
    while (((int)local_850 < (int)local_854 &&
           (Classes[(long)nClasses + 0xe] != Map[(long)(int)local_850 + 0xfe]))) {
      local_850 = local_850 + 1;
    }
    if (local_850 == local_854) {
      Map[(long)(int)local_854 + 0xfe] = Classes[(long)nClasses + 0xe];
      local_854 = local_854 + 1;
    }
    (&k)[nClasses] = local_850;
    printf("%2d}, // ",(ulong)local_850);
    Extra_PrintHex(_stdout,(uint *)&nClasses,3);
    printf(" = %3d\n",(ulong)(uint)nClasses);
  }
  return;
}

Assistant:

void Acec_GenerateNpnTable()
{
    int Table[256], Classes[16], Map[256];
    int i, k, nClasses = 0;
    for ( i = 0; i < 256; i++ )
        Table[i] = Extra_TruthCanonNPN( i, 3 );
    for ( i = 0; i < 256; i++ )
    {
        printf( "{" );
        Extra_PrintHex( stdout, (unsigned *)&Table[i], 3 );
        printf( ", " );
        // find the class
        for ( k = 0; k < nClasses; k++ )
            if ( Table[i] == Classes[k] )
                break;
        if ( k == nClasses )
            Classes[nClasses++] = Table[i];
        Map[i] = k;
        // print
        printf( "%2d}, // ", k );
        Extra_PrintHex( stdout, (unsigned *)&i, 3 );
        printf( " = %3d\n", i );
    }
}